

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameResolveTrigger(Parse *pParse,char *zDb)

{
  sqlite3 *db_00;
  Trigger *pTVar1;
  char *zName;
  Db *pDVar2;
  long lVar3;
  long lVar4;
  SrcList *pSVar5;
  int iVar6;
  Table *pTVar7;
  ExprList *pUpsertSet;
  Upsert *pUpsert;
  SrcList sSrc;
  Table *pTarget;
  undefined1 auStack_68 [4];
  int rc;
  NameContext sNC;
  TriggerStep *pStep;
  Trigger *pNew;
  sqlite3 *db;
  char *zDb_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pTVar1 = pParse->pNewTrigger;
  pTarget._4_4_ = 0;
  memset(auStack_68,0,0x38);
  zName = pTVar1->table;
  pDVar2 = db_00->aDb;
  _auStack_68 = pParse;
  iVar6 = sqlite3SchemaToIndex(db_00,pTVar1->pTabSchema);
  pTVar7 = sqlite3FindTable(db_00,zName,pDVar2[iVar6].zDbSName);
  pParse->pTriggerTab = pTVar7;
  pParse->eTriggerOp = pTVar1->op;
  if (pParse->pTriggerTab != (Table *)0x0) {
    pTarget._4_4_ = sqlite3ViewGetColumnNames(pParse,pParse->pTriggerTab);
  }
  if ((pTarget._4_4_ == 0) && (pTVar1->pWhen != (Expr *)0x0)) {
    pTarget._4_4_ = sqlite3ResolveExprNames((NameContext *)auStack_68,pTVar1->pWhen);
  }
  for (sNC.pWinSelect = (Select *)pTVar1->step_list;
      pTarget._4_4_ == 0 && sNC.pWinSelect != (Select *)0x0;
      sNC.pWinSelect = (Select *)(sNC.pWinSelect)->pOrderBy) {
    lVar3._0_4_ = (sNC.pWinSelect)->iLimit;
    lVar3._4_4_ = (sNC.pWinSelect)->iOffset;
    if ((lVar3 != 0) &&
       (sqlite3SelectPrep(pParse,*(Select **)&(sNC.pWinSelect)->iLimit,(NameContext *)auStack_68),
       pParse->nErr != 0)) {
      pTarget._4_4_ = pParse->rc;
    }
    if ((pTarget._4_4_ == 0) &&
       (lVar4._0_4_ = (sNC.pWinSelect)->selId, lVar4._4_4_ = (sNC.pWinSelect)->addrOpenEphm[0],
       lVar4 != 0)) {
      sSrc.a[0].pIBIndex =
           (Index *)sqlite3LocateTable(pParse,0,*(char **)&(sNC.pWinSelect)->selId,zDb);
      if (sSrc.a[0].pIBIndex == (Index *)0x0) {
        pTarget._4_4_ = 1;
      }
      else {
        pTarget._4_4_ = sqlite3ViewGetColumnNames(pParse,(Table *)sSrc.a[0].pIBIndex);
        if (pTarget._4_4_ == 0) {
          memset(&pUpsert,0,0x78);
          pUpsert._0_4_ = 1;
          sSrc.a[0].zDatabase = *(char **)&(sNC.pWinSelect)->selId;
          sSrc.a[0].zAlias = (char *)sSrc.a[0].pIBIndex;
          sNC.pParse = (Parse *)&pUpsert;
          if (*(long *)((sNC.pWinSelect)->addrOpenEphm + 1) != 0) {
            pTarget._4_4_ =
                 sqlite3ResolveExprNames
                           ((NameContext *)auStack_68,*(Expr **)((sNC.pWinSelect)->addrOpenEphm + 1)
                           );
          }
          if (pTarget._4_4_ == 0) {
            pTarget._4_4_ =
                 sqlite3ResolveExprListNames
                           ((NameContext *)auStack_68,(ExprList *)(sNC.pWinSelect)->pSrc);
          }
          if ((sNC.pWinSelect)->pGroupBy != (ExprList *)0x0) {
            pSVar5 = (SrcList *)(sNC.pWinSelect)->pGroupBy;
            pSVar5->a[0].pTab = (Table *)&pUpsert;
            sNC.nRef._0_2_ = 0x200;
            sNC.pSrcList = pSVar5;
            pTarget._4_4_ =
                 sqlite3ResolveExprListNames((NameContext *)auStack_68,*(ExprList **)pSVar5);
            if (pTarget._4_4_ == 0) {
              pTarget._4_4_ =
                   sqlite3ResolveExprListNames
                             ((NameContext *)auStack_68,(ExprList *)pSVar5->a[0].zDatabase);
            }
            if (pTarget._4_4_ == 0) {
              pTarget._4_4_ =
                   sqlite3ResolveExprNames((NameContext *)auStack_68,(Expr *)pSVar5->a[0].zName);
            }
            if (pTarget._4_4_ == 0) {
              pTarget._4_4_ =
                   sqlite3ResolveExprNames((NameContext *)auStack_68,(Expr *)pSVar5->a[0].pSchema);
            }
            sNC.nRef._0_2_ = 0;
          }
          sNC.pParse = (Parse *)0x0;
        }
      }
    }
  }
  return pTarget._4_4_;
}

Assistant:

static int renameResolveTrigger(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  Trigger *pNew = pParse->pNewTrigger;
  TriggerStep *pStep;
  NameContext sNC;
  int rc = SQLITE_OK;

  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  assert( pNew->pTabSchema );
  pParse->pTriggerTab = sqlite3FindTable(db, pNew->table, 
      db->aDb[sqlite3SchemaToIndex(db, pNew->pTabSchema)].zDbSName
  );
  pParse->eTriggerOp = pNew->op;
  /* ALWAYS() because if the table of the trigger does not exist, the
  ** error would have been hit before this point */
  if( ALWAYS(pParse->pTriggerTab) ){
    rc = sqlite3ViewGetColumnNames(pParse, pParse->pTriggerTab);
  }

  /* Resolve symbols in WHEN clause */
  if( rc==SQLITE_OK && pNew->pWhen ){
    rc = sqlite3ResolveExprNames(&sNC, pNew->pWhen);
  }

  for(pStep=pNew->step_list; rc==SQLITE_OK && pStep; pStep=pStep->pNext){
    if( pStep->pSelect ){
      sqlite3SelectPrep(pParse, pStep->pSelect, &sNC);
      if( pParse->nErr ) rc = pParse->rc;
    }
    if( rc==SQLITE_OK && pStep->zTarget ){
      Table *pTarget = sqlite3LocateTable(pParse, 0, pStep->zTarget, zDb);
      if( pTarget==0 ){
        rc = SQLITE_ERROR;
      }else if( SQLITE_OK==(rc = sqlite3ViewGetColumnNames(pParse, pTarget)) ){
        SrcList sSrc;
        memset(&sSrc, 0, sizeof(sSrc));
        sSrc.nSrc = 1;
        sSrc.a[0].zName = pStep->zTarget;
        sSrc.a[0].pTab = pTarget;
        sNC.pSrcList = &sSrc;
        if( pStep->pWhere ){
          rc = sqlite3ResolveExprNames(&sNC, pStep->pWhere);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3ResolveExprListNames(&sNC, pStep->pExprList);
        }
        assert( !pStep->pUpsert || (!pStep->pWhere && !pStep->pExprList) );
        if( pStep->pUpsert ){
          Upsert *pUpsert = pStep->pUpsert;
          assert( rc==SQLITE_OK );
          pUpsert->pUpsertSrc = &sSrc;
          sNC.uNC.pUpsert = pUpsert;
          sNC.ncFlags = NC_UUpsert;
          rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
          if( rc==SQLITE_OK ){
            ExprList *pUpsertSet = pUpsert->pUpsertSet;
            rc = sqlite3ResolveExprListNames(&sNC, pUpsertSet);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertWhere);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
          }
          sNC.ncFlags = 0;
        }
        sNC.pSrcList = 0;
      }
    }
  }
  return rc;
}